

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

FPinfo * amrex::FabArrayBase::TheFPinfo
                   (FabArrayBase *srcfa,FabArrayBase *dstfa,IntVect *dstng,BoxConverter *coarsener,
                   Geometry *fgeom,Geometry *cgeom,IndexSpace *index_space)

{
  int *piVar1;
  element_type *peVar2;
  element_type *peVar3;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int i;
  uint uVar8;
  int iVar9;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>
  this;
  uint uVar10;
  long lVar11;
  uint uVar12;
  IndexType IVar13;
  const_iterator __position;
  _Base_ptr __p;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
  pVar17;
  Box local_d8;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*> local_b8;
  int local_a0;
  BoxConverter *local_90;
  _Alloc_node __an;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  key_type local_68;
  Box *local_50;
  FabArrayBase *local_48;
  FabArrayBase *local_40;
  Geometry *local_38;
  
  uVar5 = *(undefined8 *)((fgeom->domain).smallend.vect + 2);
  local_d8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fgeom->domain).bigend.vect >> 0x20);
  local_d8._20_8_ = *(undefined8 *)((fgeom->domain).bigend.vect + 2);
  local_d8.smallend.vect._0_8_ = *(undefined8 *)(fgeom->domain).smallend.vect;
  local_d8.smallend.vect[2] = (int)uVar5;
  local_d8.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
  uVar8 = 0;
  switch((dstfa->boxarray).m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar8 = *(uint *)&(dstfa->boxarray).m_bat.m_op;
    break;
  default:
    uVar8 = *(uint *)((long)&(dstfa->boxarray).m_bat.m_op + 4);
  }
  local_50 = &fgeom->domain;
  lVar11 = 0;
  do {
    uVar12 = 1 << ((byte)lVar11 & 0x1f);
    uVar10 = (uint)lVar11;
    local_d8.bigend.vect[lVar11] =
         (local_d8.bigend.vect[lVar11] + (uint)((uVar8 >> (uVar10 & 0x1f) & 1) != 0)) -
         (uint)((local_d8.btype.itype >> (uVar10 & 0x1f) & 1) != 0);
    if ((uVar8 >> (uVar10 & 0x1f) & 1) == 0) {
      IVar13.itype = ~uVar12 & local_d8.btype.itype;
    }
    else {
      IVar13.itype = uVar12 | local_d8.btype.itype;
    }
    local_d8.btype.itype = IVar13.itype;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0;
  do {
    if (*(char *)((long)(fgeom->super_CoordSys).inv_dx + lVar11 + 0x19) == '\x01') {
      iVar9 = dstng->vect[lVar11];
      piVar1 = local_d8.smallend.vect + lVar11;
      *piVar1 = *piVar1 - iVar9;
      piVar1 = local_d8.bigend.vect + lVar11;
      *piVar1 = *piVar1 + iVar9;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  peVar2 = (srcfa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar3 = (srcfa->distributionMap).m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.m_ba_id.data =
       (dstfa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.m_dm_id.data =
       (dstfa->distributionMap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90 = coarsener;
  local_48 = srcfa;
  local_40 = dstfa;
  local_38 = cgeom;
  pVar17 = std::
           _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
           ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                          *)m_TheFillPatchCache,&local_68);
  __position._M_node = (_Base_ptr)pVar17.second._M_node;
  this = pVar17.first._M_node;
  do {
    bVar6 = this._M_node == __position._M_node;
    if (bVar6) {
LAB_0058721e:
      if (bVar6) {
        this._M_node = (_Base_ptr)operator_new(0x148);
        FPinfo::FPinfo((FPinfo *)this._M_node,local_48,local_40,&local_d8,dstng,local_90,local_50,
                       &local_38->domain,index_space);
        iVar9 = m_FPinfo_stats + 1;
        if (m_FPinfo_stats < DAT_0084328c) {
          iVar9 = DAT_0084328c;
        }
        m_FPinfo_stats = m_FPinfo_stats + 1;
        ((FPinfo *)this._M_node)->m_nuse = 1;
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        _DAT_00843298 = _DAT_00843298 + 1;
        lRam00000000008432a0 = lRam00000000008432a0 - auVar16._8_8_;
        local_b8.first.m_ba_id.data = local_68.m_ba_id.data;
        local_b8.first.m_dm_id.data = local_68.m_dm_id.data;
        __an._M_t = (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                     *)m_TheFillPatchCache;
        DAT_0084328c = iVar9;
        local_b8.second = (FPinfo *)this._M_node;
        std::
        _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
        ::
        _M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>::_Alloc_node>
                  ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
                    *)m_TheFillPatchCache,__position,&local_b8,&__an);
        if ((peVar2 != local_68.m_ba_id.data) || (peVar3 != local_68.m_dm_id.data)) {
          p_Var4 = (_Base_ptr)m_TheFillPatchCache._16_8_;
          if (m_TheFillPatchCache._16_8_ == 0) {
            __p = (_Base_ptr)(m_TheFillPatchCache + 8);
          }
          else {
            do {
              __p = p_Var4;
              lVar11 = 0x10;
              if ((*(element_type **)(__p + 1) <= peVar2) &&
                 ((peVar2 != *(element_type **)(__p + 1) ||
                  ((element_type *)__p[1]._M_parent <= peVar3)))) {
                lVar11 = 0x18;
              }
              p_Var4 = *(_Base_ptr *)((long)&__p->_M_color + lVar11);
            } while (p_Var4 != (_Base_ptr)0x0);
          }
          __an._M_t = (_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FPinfo_*>_>_>
                       *)m_TheFillPatchCache;
          local_b8.first.m_ba_id.data = peVar2;
          local_b8.first.m_dm_id.data = peVar3;
          local_b8.second = (FPinfo *)this._M_node;
          std::
          _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
          ::
          _M_insert_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>::_Alloc_node>
                    ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::FPinfo*>>>
                      *)m_TheFillPatchCache,(_Base_ptr)0x0,__p,&local_b8,&__an);
        }
      }
      return (FPinfo *)this._M_node;
    }
    lVar11 = *(long *)((long)&(((FPinfo *)this._M_node)->ba_crse_patch).m_bat.m_op + 0x2c);
    if ((*(element_type **)(lVar11 + 0xf0) == peVar2) &&
       (*(element_type **)(lVar11 + 0xf8) == peVar3)) {
      local_68.m_ba_id.data._4_4_ = (int)((ulong)local_68.m_ba_id.data >> 0x20);
      local_68.m_dm_id.data._4_4_ = (int)((ulong)local_68.m_dm_id.data >> 0x20);
      auVar14._0_4_ = -(uint)(*(int *)(lVar11 + 0x100) == (int)local_68.m_ba_id.data);
      auVar14._4_4_ = -(uint)(*(int *)(lVar11 + 0x104) == local_68.m_ba_id.data._4_4_);
      auVar14._8_4_ = -(uint)(*(int *)(lVar11 + 0x108) == (int)local_68.m_dm_id.data);
      auVar14._12_4_ = -(uint)(*(int *)(lVar11 + 0x10c) == local_68.m_dm_id.data._4_4_);
      auVar15._4_4_ = auVar14._0_4_;
      auVar15._0_4_ = auVar14._4_4_;
      auVar15._8_4_ = auVar14._12_4_;
      auVar15._12_4_ = auVar14._8_4_;
      iVar9 = movmskpd((int)this._M_node,auVar15 & auVar14);
      if ((iVar9 == 3) &&
         ((((bVar7 = Box::operator==((Box *)(lVar11 + 0x110),&local_d8), bVar7 &&
            (lVar11 = *(long *)((long)&(((FPinfo *)this._M_node)->ba_crse_patch).m_bat.m_op + 0x2c),
            *(int *)(lVar11 + 300) == dstng->vect[0])) &&
           (*(int *)(lVar11 + 0x130) == dstng->vect[1])) &&
          ((*(int *)(lVar11 + 0x134) == dstng->vect[2] &&
           (local_d8.btype.itype == *(uint *)(lVar11 + 0x128))))))) {
        (**(code **)**(undefined8 **)(lVar11 + 0x138))
                  (&local_b8,*(undefined8 **)(lVar11 + 0x138),lVar11 + 0x110);
        (**local_90->_vptr_BoxConverter)(&__an,local_90,&local_d8);
        if ((int)local_b8.first.m_ba_id.data == (int)__an._M_t) {
          if (((local_b8.first.m_ba_id.data._4_4_ == __an._M_t._4_4_) &&
              ((int)local_b8.first.m_dm_id.data == local_80)) &&
             ((local_b8.first.m_dm_id.data._4_4_ == local_7c &&
              ((((int)local_b8.second == local_78 && (local_b8.second._4_4_ == local_74)) &&
               (local_a0 == local_70)))))) {
            this._M_node = *(_Base_ptr *)
                            ((long)&(((FPinfo *)this._M_node)->ba_crse_patch).m_bat.m_op + 0x2c);
            ((FPinfo *)this._M_node)->m_nuse = ((FPinfo *)this._M_node)->m_nuse + 1;
            _DAT_00843298 = _DAT_00843298 + 1;
            goto LAB_0058721e;
          }
        }
      }
    }
    this._M_node = (_Base_ptr)std::_Rb_tree_increment(this._M_node);
  } while( true );
}

Assistant:

const FabArrayBase::FPinfo&
FabArrayBase::TheFPinfo (const FabArrayBase& srcfa,
                         const FabArrayBase& dstfa,
                         const IntVect&      dstng,
                         const BoxConverter& coarsener,
                         const Geometry&     fgeom,
                         const Geometry&     cgeom,
                         const EB2::IndexSpace* index_space)
{
    BL_PROFILE("FabArrayBase::TheFPinfo()");

    Box dstdomain = fgeom.Domain();
    dstdomain.convert(dstfa.boxArray().ixType());
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            dstdomain.grow(i,dstng[i]);
        }
    }

    const BDKey& srckey = srcfa.getBDKey();
    const BDKey& dstkey = dstfa.getBDKey();

    std::pair<FPinfoCacheIter,FPinfoCacheIter> er_it = m_TheFillPatchCache.equal_range(dstkey);

    for (FPinfoCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_srcbdk    == srckey    &&
            it->second->m_dstbdk    == dstkey    &&
            it->second->m_dstdomain == dstdomain &&
            it->second->m_dstng     == dstng     &&
            it->second->m_dstdomain.ixType() == dstdomain.ixType() &&
            it->second->m_coarsener->doit(it->second->m_dstdomain) == coarsener.doit(dstdomain))
        {
            ++(it->second->m_nuse);
            m_FPinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    FPinfo* new_fpc = new FPinfo(srcfa, dstfa, dstdomain, dstng, coarsener,
                                 fgeom.Domain(), cgeom.Domain(), index_space);

#ifdef AMREX_MEM_PROFILING
    m_FPinfo_stats.bytes += new_fpc->bytes();
    m_FPinfo_stats.bytes_hwm = std::max(m_FPinfo_stats.bytes_hwm, m_FPinfo_stats.bytes);
#endif

    new_fpc->m_nuse = 1;
    m_FPinfo_stats.recordBuild();
    m_FPinfo_stats.recordUse();

    m_TheFillPatchCache.insert(er_it.second, FPinfoCache::value_type(dstkey,new_fpc));
    if (srckey != dstkey)
        m_TheFillPatchCache.insert(          FPinfoCache::value_type(srckey,new_fpc));

    return *new_fpc;
}